

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void relaxSemiVariables(HighsLp *lp,bool *made_semi_variable_mods)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  undefined1 *in_RSI;
  int *in_RDI;
  HighsInt iCol;
  vector<double,_std::allocator<double>_> *relaxed_semi_variable_lower_value;
  vector<int,_std::allocator<int>_> *relaxed_semi_variable_lower_index;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  vector<double,_std::allocator<double>_> *this;
  
  *in_RSI = 0;
  sVar1 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                    ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x5e));
  if (sVar1 != 0) {
    this = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xbc);
    for (iVar4 = 0; iVar4 < *in_RDI; iVar4 = iVar4 + 1) {
      pvVar2 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x5e),
                          (long)iVar4);
      if ((*pvVar2 == kSemiContinuous) ||
         (pvVar2 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                             ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x5e)
                              ,(long)iVar4), *pvVar2 == kSemiInteger)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)this,
                   (value_type_conflict2 *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)iVar4);
        std::vector<double,_std::allocator<double>_>::push_back
                  (this,(value_type_conflict1 *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)iVar4);
        *pvVar3 = 0.0;
      }
    }
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb6));
    *in_RSI = sVar1 != 0;
  }
  return;
}

Assistant:

void relaxSemiVariables(HighsLp& lp, bool& made_semi_variable_mods) {
  // When solving relaxation, semi-variables are continuous between 0
  // and their upper bound, so have to modify the lower bound to be
  // zero
  made_semi_variable_mods = false;
  if (!lp.integrality_.size()) return;
  assert((HighsInt)lp.integrality_.size() == lp.num_col_);
  std::vector<HighsInt>& relaxed_semi_variable_lower_index =
      lp.mods_.save_relaxed_semi_variable_lower_bound_index;
  std::vector<double>& relaxed_semi_variable_lower_value =
      lp.mods_.save_relaxed_semi_variable_lower_bound_value;
  assert(relaxed_semi_variable_lower_index.size() == 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
      relaxed_semi_variable_lower_index.push_back(iCol);
      relaxed_semi_variable_lower_value.push_back(lp.col_lower_[iCol]);
      lp.col_lower_[iCol] = 0;
    }
  }
  made_semi_variable_mods = relaxed_semi_variable_lower_index.size() > 0;
}